

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoelrefpattern.h
# Opt level: O0

int __thiscall
TPZGeoElRefPattern<pzgeom::TPZQuadraticQuad>::FatherSide
          (TPZGeoElRefPattern<pzgeom::TPZQuadraticQuad> *this,int side,int son)

{
  bool bVar1;
  long *in_RDI;
  int res;
  int in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  TPZRefPattern *this_00;
  int local_1c;
  int local_4;
  
  local_1c = -1;
  bVar1 = ::TPZAutoPointer::operator_cast_to_bool((TPZAutoPointer *)(in_RDI + 0x30));
  if (bVar1) {
    this_00 = (TPZRefPattern *)&stack0xffffffffffffffd8;
    (**(code **)(*in_RDI + 0x2b0))();
    TPZAutoPointer<TPZRefPattern>::operator->((TPZAutoPointer<TPZRefPattern> *)this_00);
    local_4 = TPZRefPattern::FatherSide(this_00,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8)
    ;
    TPZAutoPointer<TPZRefPattern>::~TPZAutoPointer((TPZAutoPointer<TPZRefPattern> *)this_00);
  }
  else {
    local_4 = local_1c;
  }
  return local_4;
}

Assistant:

int TPZGeoElRefPattern<TGeo>::FatherSide(int side, int son){
	int res = -1;
	if(!fRefPattern) return res;
	return this->GetRefPattern()->FatherSide(side,son);
	
}